

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O1

void __thiscall
OpenMD::CompositeVisitor::addVisitor(CompositeVisitor *this,BaseVisitor *newVisitor,int priority)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  for (p_Var3 = (this->visitorList).
                super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&this->visitorList; p_Var3 = p_Var3->_M_next) {
    if (*(int *)&p_Var3[1]._M_prev < priority) {
      p_Var2 = (_List_node_base *)operator_new(0x20);
      p_Var2[1]._M_next = (_List_node_base *)newVisitor;
      *(int *)&p_Var2[1]._M_prev = priority;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      psVar1 = &(this->visitorList).
                super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  p_Var3 = (_List_node_base *)operator_new(0x20);
  p_Var3[1]._M_next = (_List_node_base *)newVisitor;
  *(int *)&p_Var3[1]._M_prev = priority;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->visitorList).
            super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void CompositeVisitor::addVisitor(BaseVisitor* newVisitor, int priority) {
    VisitorIterator i;
    int curPriority;

    for (i = visitorList.begin(); i != visitorList.end(); ++i) {
      curPriority = (*i).second;
      // if new visitor has higher priority, just insert it before current
      // visitor
      if (priority > curPriority) {
        visitorList.insert(i, std::make_pair(newVisitor, priority));
      }
    }

    // if new visitor has lowest priority, insert it at the end of the list
    visitorList.insert(visitorList.end(), std::make_pair(newVisitor, priority));
  }